

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

string * __thiscall
cmGeneratorTarget::GetCompilePDBName
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config)

{
  cmValue cVar1;
  NameComponents *pNVar2;
  string configProp;
  string configUpper;
  allocator<char> local_81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  string local_40;
  
  cmsys::SystemTools::UpperCase(&local_40,config);
  cmStrCat<char_const(&)[18],std::__cxx11::string&>
            (&local_60,(char (*) [18])"COMPILE_PDB_NAME_",&local_40);
  cVar1 = GetProperty(this,&local_60);
  if ((cVar1.Value == (string *)0x0) || ((cVar1.Value)->_M_string_length == 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"COMPILE_PDB_NAME",&local_81);
    cVar1 = GetProperty(this,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    if ((cVar1.Value == (string *)0x0) || ((cVar1.Value)->_M_string_length == 0)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_80);
      goto LAB_0048b10c;
    }
    pNVar2 = GetFullNameInternalComponents(this,config,RuntimeBinaryArtifact);
    std::operator+(&local_80,&pNVar2->prefix,cVar1.Value);
    std::operator+(__return_storage_ptr__,&local_80,".pdb");
  }
  else {
    pNVar2 = GetFullNameInternalComponents(this,config,RuntimeBinaryArtifact);
    std::operator+(&local_80,&pNVar2->prefix,cVar1.Value);
    std::operator+(__return_storage_ptr__,&local_80,".pdb");
  }
  std::__cxx11::string::~string((string *)&local_80);
LAB_0048b10c:
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetCompilePDBName(
  const std::string& config) const
{
  // Check for a per-configuration output directory target property.
  std::string configUpper = cmSystemTools::UpperCase(config);
  std::string configProp = cmStrCat("COMPILE_PDB_NAME_", configUpper);
  cmValue config_name = this->GetProperty(configProp);
  if (cmNonempty(config_name)) {
    NameComponents const& components = GetFullNameInternalComponents(
      config, cmStateEnums::RuntimeBinaryArtifact);
    return components.prefix + *config_name + ".pdb";
  }

  cmValue name = this->GetProperty("COMPILE_PDB_NAME");
  if (cmNonempty(name)) {
    NameComponents const& components = GetFullNameInternalComponents(
      config, cmStateEnums::RuntimeBinaryArtifact);
    return components.prefix + *name + ".pdb";
  }

  return "";
}